

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect_format.c
# Opt level: O0

log_aspect_interface log_aspect_format_interface(void)

{
  return &log_aspect_format_interface::aspect_interface_format;
}

Assistant:

log_aspect_interface log_aspect_format_interface(void)
{
	static struct log_aspect_format_impl_type log_aspect_format_impl_obj = {
		&log_aspect_format_impl_size,
		&log_aspect_format_impl_serialize,
		&log_aspect_format_impl_deserialize
	};

	static struct log_aspect_interface_type aspect_interface_format = {
		&log_aspect_format_create,
		&log_aspect_format_impl_obj,
		&log_aspect_format_destroy
	};

	return &aspect_interface_format;
}